

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::ProgressTask::update(ProgressTask *this)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  uint uVar3;
  ProgressClient *pPVar4;
  undefined8 *puVar5;
  uint uVar6;
  undefined8 in_RSI;
  
  uVar1 = this->step_;
  uVar2 = uVar1 * 100;
  uVar3 = uVar2 / this->max_steps_;
  uVar6 = 100;
  if (uVar3 < 100) {
    uVar6 = uVar3;
  }
  if ((uVar6 != this->percent_) && (this->percent_ = uVar6, this->quiet_ == false)) {
    if (::(anonymous_namespace)::task_canceled_ == '\x01') {
      puVar5 = (undefined8 *)
               __cxa_allocate_exception(8,in_RSI,(ulong)uVar2 % (ulong)this->max_steps_);
      *puVar5 = &PTR__exception_001a8150;
      __cxa_throw(puVar5,&TaskCanceled::typeinfo,std::exception::~exception);
    }
    if (::(anonymous_namespace)::progress_client_ != 0) {
      pPVar4 = SmartPointer<GEO::ProgressClient>::operator->
                         ((SmartPointer<GEO::ProgressClient> *)
                          &::(anonymous_namespace)::progress_client_);
      UNRECOVERED_JUMPTABLE = (pPVar4->super_Counted)._vptr_Counted[3];
      (*UNRECOVERED_JUMPTABLE)(pPVar4,(ulong)uVar1,(ulong)uVar6,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void ProgressTask::update() {
	index_t new_percent =
	    std::min(index_t(100), index_t(step_ * 100 / max_steps_));
	if(new_percent != percent_) {
	    percent_ = new_percent;
	    if(!quiet_) {
		task_progress(step_, percent_);
	    }
	}
    }